

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<pbrt::FloatTexture_const&,pbrt::FloatTexture_const&,pbrt::Spectrum_const&,pbrt::FloatTexture_const&,pbrt::SpectrumTexture_const&,pbrt::FloatTexture_const&,pbrt::FloatTexture_const&,pbrt::SpectrumTexture_const&,pbrt::SpectrumTexture_const&,pbrt::SpectrumTexture_const&,bool_const&,int_const&,int_const&>
               (string *s,char *fmt,FloatTexture *v,FloatTexture *args,Spectrum *args_1,
               FloatTexture *args_2,SpectrumTexture *args_3,FloatTexture *args_4,
               FloatTexture *args_5,SpectrumTexture *args_6,SpectrumTexture *args_7,
               SpectrumTexture *args_8,bool *args_9,int *args_10,int *args_11)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char *in_RCX;
  string *in_RDX;
  FloatTexture *unaff_RBP;
  string *in_RDI;
  FloatTexture *in_R8;
  Spectrum *in_R9;
  FloatTexture *unaff_R15;
  SpectrumTexture *unaff_retaddr;
  SpectrumTexture *in_stack_00000008;
  SpectrumTexture *in_stack_00000010;
  bool *in_stack_00000018;
  int *in_stack_00000020;
  int *in_stack_00000028;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  FloatTexture *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  string *in_stack_fffffffffffffd50;
  char **in_stack_fffffffffffffd58;
  char **in_stack_fffffffffffffd60;
  FloatTexture *in_stack_fffffffffffffd68;
  ostream *in_stack_fffffffffffffd70;
  string local_288 [32];
  string local_268 [32];
  undefined8 local_248;
  string local_240 [24];
  char *in_stack_fffffffffffffdd8;
  stringstream local_220 [4];
  int in_stack_fffffffffffffde4;
  char *in_stack_fffffffffffffde8;
  LogLevel in_stack_fffffffffffffdf4;
  string local_80 [16];
  SpectrumTexture *in_stack_ffffffffffffff90;
  FloatTexture *in_stack_ffffffffffffff98;
  
  copyToFormatString(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  lVar1 = std::__cxx11::string::find((char)local_80,0x2a);
  lVar2 = std::__cxx11::string::find((char)local_80,0x73);
  lVar3 = std::__cxx11::string::find((char)local_80,100);
  if (lVar1 != -1) {
    LogFatal(in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
             in_stack_fffffffffffffdd8);
  }
  if (lVar3 != -1) {
    LogFatal(in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
             in_stack_fffffffffffffdd8);
  }
  if (lVar2 == -1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
               in_stack_fffffffffffffdd8);
    }
    std::__cxx11::string::c_str();
    formatOne<pbrt::FloatTexture_const&>(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    std::__cxx11::string::operator+=(in_RDI,local_288);
    std::__cxx11::string::~string(local_288);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_220);
    pbrt::operator<<(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    local_248 = std::__cxx11::string::c_str();
    formatOne<char_const*>((char *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    std::__cxx11::string::operator+=(in_RDI,local_240);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::stringstream::~stringstream(local_220);
  }
  stringPrintfRecursive<pbrt::FloatTexture_const&,pbrt::Spectrum_const&,pbrt::FloatTexture_const&,pbrt::SpectrumTexture_const&,pbrt::FloatTexture_const&,pbrt::FloatTexture_const&,pbrt::SpectrumTexture_const&,pbrt::SpectrumTexture_const&,pbrt::SpectrumTexture_const&,bool_const&,int_const&,int_const&>
            (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,unaff_R15
             ,unaff_RBP,unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
             in_stack_00000020,in_stack_00000028);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}